

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

AVisitor<hiberlite::KillChildren> * __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::operator&
          (AVisitor<hiberlite::KillChildren> *this,sql_nvp<std::pair<int,_double>_> *nvp)

{
  string local_38 [32];
  sql_nvp<std::pair<int,_double>_> *local_18;
  sql_nvp<std::pair<int,_double>_> *nvp_local;
  AVisitor<hiberlite::KillChildren> *this_local;
  
  local_18 = nvp;
  nvp_local = (sql_nvp<std::pair<int,_double>_> *)this;
  std::__cxx11::string::string(local_38,(string *)nvp);
  divePrefix(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  walk<std::pair<int,double>>(this,nvp->value);
  pop(this);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(sql_nvp<X> nvp)
{
	divePrefix(nvp.name);
		walk(nvp.value);
	pop();
	return *this;
}